

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorPool::Tables::ClearLastCheckpoint(Tables *this)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  Tables *local_10;
  Tables *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
          ::empty(&this->checkpoints_);
  local_49 = 0;
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x244);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: !checkpoints_.empty(): ");
    internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  std::
  vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ::pop_back(&this->checkpoints_);
  bVar1 = std::
          vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
          ::empty(&this->checkpoints_);
  if (bVar1) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
              (&this->symbols_after_checkpoint_);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::clear(&this->files_after_checkpoint_);
    std::
    vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
    ::clear(&this->extensions_after_checkpoint_);
  }
  return;
}

Assistant:

void DescriptorPool::Tables::ClearLastCheckpoint() {
  GOOGLE_DCHECK(!checkpoints_.empty());
  checkpoints_.pop_back();
  if (checkpoints_.empty()) {
    // All checkpoints have been cleared: we can now commit all of the pending
    // data.
    symbols_after_checkpoint_.clear();
    files_after_checkpoint_.clear();
    extensions_after_checkpoint_.clear();
  }
}